

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form4_ConvertToGrayScale(ConvertToGrayScaleForm4 ConvertToGrayScale)

{
  uint8_t uVar1;
  bool bVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  Image output;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,2);
  uVar1 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,uVar1,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  uVar1 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1];
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&size,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,uVar1,0,0,(Image *)&size);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&size);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&size,2,(allocator_type *)&roiX);
  pVar3 = Unit_Test::imageSize(&input);
  *size.
   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
   ._M_impl.super__Vector_impl_data._M_start = pVar3;
  pVar3 = Unit_Test::imageSize(&output);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pVar3;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&size,&roiX,&roiY,&roiWidth,&roiHeight);
  (*ConvertToGrayScale)
            (&input,*roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
             *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,&output,
             roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],roiWidth,roiHeight);
  bVar2 = Unit_Test::verifyImage
                    (&output,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[1],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],roiWidth,roiHeight,
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&size.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form4_ConvertToGrayScale(ConvertToGrayScaleForm4 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformRGBImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage   ( intensity[1] );

        std::vector < std::pair <uint32_t, uint32_t> > size( 2 );

        size[0] = imageSize( input );
        size[1] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        ConvertToGrayScale( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight );

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, intensity[0] );
    }